

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O3

void __thiscall OpenMD::CutoffGroup::updateCOM(CutoffGroup *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  Atom *pAVar5;
  DataStoragePointer DVar6;
  Snapshot *pSVar7;
  pointer ppAVar8;
  undefined8 uVar9;
  double dVar10;
  uint uVar11;
  uint i_5;
  pointer pVVar12;
  uint i_4;
  long lVar13;
  pointer ppAVar14;
  DataStorage *this_00;
  long lVar15;
  pointer pVVar16;
  uint i;
  RealType RVar17;
  Vector<double,_3U> result;
  double local_58 [4];
  double local_38 [4];
  
  this_00 = (DataStorage *)
            ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->storage_);
  uVar11 = DataStorage::getStorageLayout(this_00);
  ppAVar14 = (this->cutoffAtomList).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)(this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppAVar14 == 8) {
    pAVar5 = *ppAVar14;
    DVar6 = (pAVar5->super_StuntDouble).storage_;
    pSVar7 = ((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar13 = (long)(pAVar5->super_StuntDouble).localIndex_;
    lVar15 = *(long *)((long)&(pSVar7->atomData).position + DVar6);
    iVar4 = this->localIndex_;
    pVVar12 = (this_00->position).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (undefined8 *)(lVar15 + lVar13 * 0x18);
    uVar9 = *puVar1;
    dVar3 = (double)puVar1[1];
    *(double *)((long)pVVar12[iVar4].super_Vector<double,_3U>.data_ + 0x10) =
         *(double *)(lVar15 + 0x10 + lVar13 * 0x18);
    pVVar12 = pVVar12 + iVar4;
    (pVVar12->super_Vector<double,_3U>).data_[0] = (double)uVar9;
    *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + 8) = dVar3;
    if ((uVar11 & 2) != 0) {
      lVar15 = *(long *)((long)&(pSVar7->atomData).velocity + DVar6);
      pVVar12 = (this_00->velocity).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = (double *)(lVar15 + lVar13 * 0x18);
      dVar3 = *pdVar2;
      dVar10 = pdVar2[1];
      pVVar12[iVar4].super_Vector<double,_3U>.data_[2] = *(double *)(lVar15 + 0x10 + lVar13 * 0x18);
      pVVar12 = pVVar12 + iVar4;
      (pVVar12->super_Vector<double,_3U>).data_[0] = dVar3;
      (pVVar12->super_Vector<double,_3U>).data_[1] = dVar10;
    }
  }
  else {
    RVar17 = getMass(this);
    iVar4 = this->localIndex_;
    pVVar12 = (this_00->position).
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start + iVar4;
    if (pVVar12 != (pointer)&OpenMD::V3Zero) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar15) =
             *(undefined8 *)((long)&OpenMD::V3Zero + lVar15);
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x18);
    }
    if (((uVar11 & 2) != 0) &&
       (pVVar16 = (this_00->velocity).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar4,
       pVVar16 != (pointer)&OpenMD::V3Zero)) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)(pVVar16->super_Vector<double,_3U>).data_ + lVar15) =
             *(undefined8 *)((long)&OpenMD::V3Zero + lVar15);
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x18);
    }
    ppAVar14 = (this->cutoffAtomList).
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppAVar8 = (this->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar14 != ppAVar8) {
      pAVar5 = *ppAVar14;
      while (pAVar5 != (Atom *)0x0) {
        dVar3 = (pAVar5->super_StuntDouble).mass_;
        lVar13 = (long)(pAVar5->super_StuntDouble).localIndex_;
        lVar15 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                  atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (pAVar5->super_StuntDouble).storage_);
        local_38[2] = (double)*(undefined8 *)(lVar15 + 0x10 + lVar13 * 0x18);
        pdVar2 = (double *)(lVar15 + lVar13 * 0x18);
        local_38[0] = *pdVar2;
        local_38[1] = pdVar2[1];
        local_58[0] = 0.0;
        local_58[1] = 0.0;
        local_58[2] = 0.0;
        lVar15 = 0;
        do {
          local_58[lVar15] = local_38[lVar15] * dVar3;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        lVar15 = 0;
        do {
          *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar15 * 8) =
               local_58[lVar15] +
               *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar15 * 8);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        if ((uVar11 & 2) != 0) {
          dVar3 = (pAVar5->super_StuntDouble).mass_;
          lVar13 = (long)(pAVar5->super_StuntDouble).localIndex_;
          lVar15 = *(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar5->super_StuntDouble).storage_);
          local_38[2] = (double)*(undefined8 *)(lVar15 + 0x10 + lVar13 * 0x18);
          pdVar2 = (double *)(lVar15 + lVar13 * 0x18);
          local_38[0] = *pdVar2;
          local_38[1] = pdVar2[1];
          local_58[0] = 0.0;
          local_58[1] = 0.0;
          local_58[2] = 0.0;
          lVar15 = 0;
          do {
            local_58[lVar15] = local_38[lVar15] * dVar3;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          pVVar16 = (this_00->velocity).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar15 = 0;
          do {
            pVVar16[iVar4].super_Vector<double,_3U>.data_[lVar15] =
                 local_58[lVar15] + pVVar16[iVar4].super_Vector<double,_3U>.data_[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
        }
        ppAVar14 = ppAVar14 + 1;
        if (ppAVar14 == ppAVar8) break;
        pAVar5 = *ppAVar14;
      }
    }
    lVar15 = 0;
    do {
      *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar15 * 8) =
           *(double *)((long)(pVVar12->super_Vector<double,_3U>).data_ + lVar15 * 8) / RVar17;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    if ((uVar11 & 2) != 0) {
      pVVar12 = (this_00->velocity).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        pVVar12[iVar4].super_Vector<double,_3U>.data_[lVar15] =
             pVVar12[iVar4].super_Vector<double,_3U>.data_[lVar15] / RVar17;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
    }
  }
  return;
}

Assistant:

void updateCOM() {
      DataStorage& data = snapshotMan_->getCurrentSnapshot()->*storage_;
      bool needsVel     = false;
      if (data.getStorageLayout() & DataStorage::dslVelocity) needsVel = true;

      if (cutoffAtomList.size() == 1) {
        data.position[localIndex_] = cutoffAtomList[0]->getPos();
        if (needsVel) data.velocity[localIndex_] = cutoffAtomList[0]->getVel();
      } else {
        std::vector<Atom*>::iterator i;
        Atom* atom;
        RealType totalMass         = getMass();
        data.position[localIndex_] = V3Zero;
        if (needsVel) data.velocity[localIndex_] = V3Zero;

        for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          data.position[localIndex_] += atom->getMass() * atom->getPos();
          if (needsVel)
            data.velocity[localIndex_] += atom->getMass() * atom->getVel();
        }
        data.position[localIndex_] /= totalMass;
        if (needsVel) data.velocity[localIndex_] /= totalMass;
      }
    }